

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::contextCallback(CLIntercept *this,string *errinfo,void *private_info,size_t cb)

{
  double __x;
  char str [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  char local_128 [256];
  
  memset(local_128,0,0x100);
  snprintf(local_128,0x100,"=======> Context Callback (private_info = %p, cb = %zu):\n",private_info
           ,cb);
  std::mutex::lock(&this->m_Mutex);
  std::operator+(&bStack_188,local_128,errinfo);
  std::operator+(&local_168,&bStack_188,"\n");
  std::operator+(&local_148,&local_168,"<======= End of Context Callback\n");
  log(this,__x);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&bStack_188);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::contextCallback(
    const std::string& errinfo,
    const void* private_info,
    size_t cb )
{
    char    str[256] = "";
    CLI_SPRINTF( str, 256, "=======> Context Callback (private_info = %p, cb = %zu):\n",
        private_info,
        cb );

    std::lock_guard<std::mutex> lock(m_Mutex);
    log( str + errinfo + "\n" + "<======= End of Context Callback\n" );
}